

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.h
# Opt level: O1

void __thiscall sptk::RealValuedFastFourierTransform::Buffer::~Buffer(Buffer *this)

{
  pointer pdVar1;
  
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_00110c38;
  pdVar1 = (this->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->real_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Buffer() {
    }